

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

boolean can_advance(int skill,boolean speedy)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool local_10;
  bool local_f;
  bool local_e;
  boolean speedy_local;
  int skill_local;
  
  local_e = false;
  if ((u.weapon_skills[skill].skill != '\0') &&
     (local_e = false, u.weapon_skills[skill].skill < u.weapon_skills[skill].max_skill)) {
    if ((flags.debug == '\0') || (local_f = true, speedy == '\0')) {
      uVar1 = u.weapon_skills[skill].advance;
      uVar3 = practice_needed_to_advance(skill,(int)u.weapon_skills[skill].skill);
      iVar2 = u.weapon_slots;
      local_10 = false;
      if ((uVar3 <= uVar1) && (local_10 = false, u.skills_advanced < 0x3c)) {
        iVar4 = slots_required(skill);
        local_10 = iVar4 <= iVar2;
      }
      local_f = local_10;
    }
    local_e = local_f;
  }
  return local_e;
}

Assistant:

boolean can_advance(int skill, boolean speedy)
{
    return !P_RESTRICTED(skill)
	    && P_SKILL(skill) < P_MAX_SKILL(skill) && (
	    (wizard && speedy) || (P_ADVANCE(skill) >=
		(unsigned) practice_needed_to_advance(skill, P_SKILL(skill))
	    && u.skills_advanced < P_SKILL_LIMIT
	    && u.weapon_slots >= slots_required(skill)));
}